

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O3

SpatialVector * __thiscall
RigidBodyDynamics::Math::SpatialTransform::apply(SpatialTransform *this,SpatialVector *v_sp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  SpatialVector *in_RDI;
  double dVar19;
  double dVar20;
  double dVar21;
  
  dVar1 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  dVar2 = (v_sp->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar3 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2];
  dVar4 = (v_sp->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar5 = (v_sp->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar20 = dVar3 * dVar5 +
           ((v_sp->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] -
           dVar1 * dVar2);
  dVar6 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0];
  dVar21 = dVar6 * dVar2 +
           ((v_sp->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] -
           dVar3 * dVar4);
  dVar19 = dVar1 * dVar4 +
           ((v_sp->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] -
           dVar6 * dVar5);
  dVar7 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[3];
  dVar8 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[4];
  dVar9 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[0];
  dVar10 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[1];
  dVar11 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[1];
  dVar12 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[2];
  dVar13 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[6];
  dVar14 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[7];
  dVar1 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[5];
  dVar3 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[2];
  dVar6 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[8];
  dVar15 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[4];
  dVar16 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[5];
  dVar17 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[7];
  dVar18 = (this->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[8];
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       dVar2 * dVar13 + dVar4 * dVar9 + dVar5 * dVar7;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       dVar2 * dVar14 + dVar4 * dVar10 + dVar5 * dVar8;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       dVar2 * dVar6 + dVar4 * dVar3 + dVar1 * dVar5;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       dVar19 * dVar13 + dVar20 * dVar9 + dVar7 * dVar21;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       dVar19 * dVar17 + dVar20 * dVar11 + dVar21 * dVar15;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       dVar19 * dVar18 + dVar20 * dVar12 + dVar21 * dVar16;
  return in_RDI;
}

Assistant:

SpatialVector apply (const SpatialVector &v_sp) {
    Vector3d v_rxw (
        v_sp[3] - r[1]*v_sp[2] + r[2]*v_sp[1],
        v_sp[4] - r[2]*v_sp[0] + r[0]*v_sp[2],
        v_sp[5] - r[0]*v_sp[1] + r[1]*v_sp[0]
        );
    return SpatialVector (
        E(0,0) * v_sp[0] + E(0,1) * v_sp[1] + E(0,2) * v_sp[2],
        E(1,0) * v_sp[0] + E(1,1) * v_sp[1] + E(1,2) * v_sp[2],
        E(2,0) * v_sp[0] + E(2,1) * v_sp[1] + E(2,2) * v_sp[2],
        E(0,0) * v_rxw[0] + E(0,1) * v_rxw[1] + E(0,2) * v_rxw[2],
        E(1,0) * v_rxw[0] + E(1,1) * v_rxw[1] + E(1,2) * v_rxw[2],
        E(2,0) * v_rxw[0] + E(2,1) * v_rxw[1] + E(2,2) * v_rxw[2]
        );
  }